

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

string * __thiscall CLI::Option::help_pname_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream out;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pcVar1 = (this->pname_)._M_dataplus._M_p;
  local_1e8 = local_1d8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + (this->pname_)._M_string_length);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>(local_198,local_1e8,local_1e0);
  help_aftername_abi_cxx11_(&local_1c8,this);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string help_pname() const {
        std::stringstream out;
        out << get_pname() << help_aftername();
        return out.str();
    }